

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O1

bool si9ma::BinaryTree::is_complete_binary_tree(TreeNode *head)

{
  TreeNode *pTVar1;
  TreeNode *in_RDI;
  bool bVar2;
  bool bVar3;
  queue<const_si9ma::TreeNode_*,_std::deque<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>_>
  node_queue;
  TreeNode *local_70;
  _Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_> local_68;
  
  if (in_RDI == (TreeNode *)0x0) {
    bVar3 = true;
  }
  else {
    local_68._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_68._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_68._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_68._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_68._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_68._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_68._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_68._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_68._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_68._M_impl.super__Deque_impl_data._M_map_size = 0;
    local_70 = in_RDI;
    std::_Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>::
    _M_initialize_map(&local_68,0);
    if (local_68._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_68._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>>::
      _M_push_back_aux<si9ma::TreeNode_const*const&>
                ((deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>> *)&local_68,
                 &local_70);
    }
    else {
      *local_68._M_impl.super__Deque_impl_data._M_finish._M_cur = local_70;
      local_68._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_68._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    bVar3 = local_68._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_68._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (!bVar3) {
      bVar2 = false;
      do {
        local_70 = *local_68._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (local_68._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_68._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_68._M_impl.super__Deque_impl_data._M_start._M_first);
          local_68._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_68._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_68._M_impl.super__Deque_impl_data._M_start._M_last =
               local_68._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
          local_68._M_impl.super__Deque_impl_data._M_start._M_first =
               local_68._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_68._M_impl.super__Deque_impl_data._M_start._M_node =
               local_68._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_68._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_68._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        if ((bVar2) && ((local_70->left != (TreeNode *)0x0 || (local_70->right != (TreeNode *)0x0)))
           ) break;
        pTVar1 = local_70->left;
        if (pTVar1 == (TreeNode *)0x0) {
          if (local_70->right != (TreeNode *)0x0) break;
LAB_0010ba59:
          bVar2 = true;
        }
        else if (local_70->right == (TreeNode *)0x0) goto LAB_0010ba59;
        if (pTVar1 != (TreeNode *)0x0) {
          if (local_68._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_68._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>>::
            _M_push_back_aux<si9ma::TreeNode_const*const&>
                      ((deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>> *)
                       &local_68,&local_70->left);
          }
          else {
            *local_68._M_impl.super__Deque_impl_data._M_finish._M_cur = pTVar1;
            local_68._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_68._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
        if (local_70->right != (TreeNode *)0x0) {
          if (local_68._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_68._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>>::
            _M_push_back_aux<si9ma::TreeNode_const*const&>
                      ((deque<si9ma::TreeNode_const*,std::allocator<si9ma::TreeNode_const*>> *)
                       &local_68,&local_70->right);
          }
          else {
            *local_68._M_impl.super__Deque_impl_data._M_finish._M_cur = local_70->right;
            local_68._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_68._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
        bVar3 = local_68._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_68._M_impl.super__Deque_impl_data._M_start._M_cur;
      } while (!bVar3);
    }
    std::_Deque_base<const_si9ma::TreeNode_*,_std::allocator<const_si9ma::TreeNode_*>_>::
    ~_Deque_base(&local_68);
  }
  return bVar3;
}

Assistant:

bool BinaryTree::is_complete_binary_tree(const si9ma::TreeNode *head) {
        if (head == nullptr)
            return true;

        bool leaf = false;
        queue<const TreeNode *> node_queue;
        node_queue.push(head);
        while (!node_queue.empty()){
            head = node_queue.front();
            node_queue.pop();

            if ((leaf && (head->left != nullptr || head->right != nullptr))
                 || (head->left == nullptr && head->right != nullptr))
                return false;

            if (head->left == nullptr || head->right == nullptr)
                leaf = true;

            if (head->left != nullptr)
                node_queue.push(head->left);

            if (head->right != nullptr)
                node_queue.push(head->right);
        }

        return true;
    }